

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

bool __thiscall
duckdb_shell::ShellState::SetOutputFile(ShellState *this,char **azArg,idx_t nArg,char output_mode)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  FILE *__s;
  char *pcVar6;
  char *__s1;
  ulong uVar7;
  char *pcVar8;
  uint bTextMode;
  bool bVar9;
  int local_64;
  char *local_58;
  
  if (safe_mode == '\x01') {
    SetOutputFile();
LAB_00217ade:
    bVar9 = false;
  }
  else {
    iVar4 = 2;
    if (output_mode == 'e') {
      local_64 = 0x78;
    }
    else if (output_mode == 'o') {
      local_64 = 0;
    }
    else {
      local_64 = 0;
      iVar4 = 0;
    }
    bVar9 = nArg >= 2;
    if (nArg < 2) {
      local_58 = (char *)0x0;
      bVar2 = false;
    }
    else {
      uVar7 = 2;
      bVar2 = false;
      local_58 = (char *)0x0;
      do {
        pcVar8 = azArg[uVar7 - 1];
        if (*pcVar8 == '-') {
          __s1 = pcVar8 + 1;
          if (pcVar8[1] != '-') {
            __s1 = pcVar8;
          }
          iVar3 = strcmp(__s1,"-bom");
          bVar1 = true;
          if (iVar3 == 0) {
            bVar2 = true;
          }
          else {
            pcVar6 = "ERROR: unknown option: \"%s\".  Usage:\n";
            if (output_mode == 'e') {
LAB_0021788d:
              bVar1 = false;
              fprintf((FILE *)this->out,pcVar6,pcVar8);
              showHelp(this->out,*azArg);
            }
            else {
              iVar3 = strcmp(__s1,"-x");
              if (iVar3 == 0) {
                local_64 = 0x78;
              }
              else {
                iVar3 = strcmp(__s1,"-e");
                pcVar6 = "ERROR: unknown option: \"%s\".  Usage:\n";
                if (iVar3 != 0) goto LAB_0021788d;
                local_64 = 0x65;
              }
            }
          }
        }
        else {
          pcVar6 = "ERROR: extra parameter: \"%s\".  Usage:\n";
          if (local_58 != (char *)0x0) goto LAB_0021788d;
          bVar1 = true;
          local_58 = pcVar8;
        }
        if (!bVar1) break;
        bVar9 = uVar7 < nArg;
        lVar5 = (1 - nArg) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar5 != 1);
    }
    bTextMode = 0;
    if (bVar9) {
      return false;
    }
    pcVar8 = "stdout";
    if (local_58 != (char *)0x0) {
      pcVar8 = local_58;
    }
    this->outCount = iVar4;
    ResetOutput(this);
    if ((local_64 == 0x78) || (local_64 == 0x65)) {
      this->doXdgOpen = '\x01';
      this->modePrior = this->mode;
      this->priorShFlgs = this->shellFlgs;
      std::__cxx11::string::_M_assign((string *)&this->colSepPrior);
      std::__cxx11::string::_M_assign((string *)&this->rowSepPrior);
      if (local_64 != 0x78) {
        NewTempFile(this,"txt");
      }
      else {
        NewTempFile(this,"csv");
        *(byte *)&this->shellFlgs = (byte)this->shellFlgs & 0xbf;
        this->mode = CSV;
        std::__cxx11::string::_M_replace
                  ((ulong)&this->colSeparator,0,(char *)(this->colSeparator)._M_string_length,
                   0x14a85a6);
        std::__cxx11::string::_M_replace
                  ((ulong)&this->rowSeparator,0,(char *)(this->rowSeparator)._M_string_length,
                   0x136e2be);
      }
      bTextMode = (uint)(local_64 != 0x78);
      pcVar8 = this->zTempFile;
    }
    if (*pcVar8 == '|') {
      __s = popen(pcVar8 + 1,"w");
      this->out = (FILE *)__s;
      if (__s == (FILE *)0x0) {
        fprintf(_stderr,"Error: cannot open pipe \"%s\"\n",pcVar8 + 1);
        this->out = _stdout;
        return false;
      }
    }
    else {
      __s = (FILE *)output_file_open(pcVar8,bTextMode);
      this->out = (FILE *)__s;
      if (__s == (FILE *)0x0) {
        iVar4 = strcmp(pcVar8,"off");
        if (iVar4 != 0) {
          fprintf(_stderr,"Error: cannot write to \"%s\"\n",pcVar8);
        }
        this->out = _stdout;
        goto LAB_00217ade;
      }
    }
    if (bVar2) {
      fwrite(anon_var_dwarf_b279,3,1,__s);
    }
    pcVar6 = (char *)(this->outfile)._M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)&this->outfile,0,pcVar6,(ulong)pcVar8);
    stdout_is_console = false;
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool ShellState::SetOutputFile(const char **azArg, idx_t nArg, char output_mode) {
	if (safe_mode) {
		utf8_printf(stderr, ".output/.once/.excel cannot be used in -safe mode\n");
		return false;
	}
	const char *zFile = nullptr;
	int bTxtMode = 0;
	int eMode = 0;
	bool bBOM = false;
	int bOnce = 0; /* 0: .output, 1: .once, 2: .excel */

	if (output_mode == 'e') {
		// .excel
		eMode = 'x';
		bOnce = 2;
	} else if (output_mode == 'o') {
		// .once
		bOnce = 1;
	}
	for (idx_t i = 1; i < nArg; i++) {
		const char *z = azArg[i];
		if (z[0] == '-') {
			if (z[1] == '-') {
				z++;
			}
			if (strcmp(z, "-bom") == 0) {
				bBOM = true;
			} else if (output_mode != 'e' && strcmp(z, "-x") == 0) {
				eMode = 'x'; /* spreadsheet */
			} else if (output_mode != 'e' && strcmp(z, "-e") == 0) {
				eMode = 'e'; /* text editor */
			} else {
				utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", azArg[i]);
				showHelp(out, azArg[0]);
				return false;
			}
		} else if (!zFile) {
			zFile = z;
		} else {
			utf8_printf(out, "ERROR: extra parameter: \"%s\".  Usage:\n", azArg[i]);
			showHelp(out, azArg[0]);
			return false;
		}
	}
	if (!zFile) {
		zFile = "stdout";
	}
	if (bOnce) {
		outCount = 2;
	} else {
		outCount = 0;
	}
	ResetOutput();
#ifndef SQLITE_NOHAVE_SYSTEM
	if (eMode == 'e' || eMode == 'x') {
		doXdgOpen = 1;
		PushOutputMode();
		if (eMode == 'x') {
			/* spreadsheet mode.  Output as CSV. */
			NewTempFile("csv");
			ShellClearFlag(SHFLG_Echo);
			mode = RenderMode::CSV;
			colSeparator = SEP_Comma;
			rowSeparator = SEP_CrLf;
		} else {
			/* text editor mode */
			NewTempFile("txt");
			bTxtMode = 1;
		}
		zFile = zTempFile;
	}
#endif /* SQLITE_NOHAVE_SYSTEM */
	if (zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		out = stdout;
		return false;
#else
		out = popen(zFile + 1, "w");
		if (out == 0) {
			utf8_printf(stderr, "Error: cannot open pipe \"%s\"\n", zFile + 1);
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
#endif
	} else {
		out = output_file_open(zFile, bTxtMode);
		if (!out) {
			if (strcmp(zFile, "off") != 0) {
				utf8_printf(stderr, "Error: cannot write to \"%s\"\n", zFile);
			}
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
	}
	stdout_is_console = false;
	return true;
}